

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_abstract_transaction.cpp
# Opt level: O0

bool __thiscall
TestTransaction::CopyVariableBufferTest
          (TestTransaction *this,string *test_data,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *buffer)

{
  byte bVar1;
  long lVar2;
  uchar *puVar3;
  size_type bytes_len;
  uchar *bytes_out;
  uint8_t *puVar4;
  int diff_size;
  int local_48;
  uint8_t *ptr;
  vector<unsigned_char,_std::allocator<unsigned_char>_> test_array;
  bool is_success;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *buffer_local;
  string *test_data_local;
  TestTransaction *this_local;
  
  test_array.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  lVar2 = std::__cxx11::string::length();
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)buffer,lVar2 + 10);
  cfd::core::StringUtil::StringToByte
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ptr,(string *)test_data);
  puVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ptr);
  bytes_len = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ptr);
  bytes_out = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)buffer);
  puVar4 = cfd::core::AbstractTransaction::CopyVariableBuffer(puVar3,bytes_len,bytes_out);
  puVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)buffer);
  if (puVar4 != puVar3) {
    local_48 = (int)puVar4;
    puVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)buffer);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)buffer,
               (long)(local_48 - (int)puVar3));
    test_array.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
  }
  bVar1 = test_array.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._7_1_;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ptr);
  return (bool)(bVar1 & 1);
}

Assistant:

bool CopyVariableBufferTest(const std::string &test_data,
      std::vector<uint8_t> *buffer) {
    bool is_success = false;
    buffer->resize(test_data.length() + 10);
    std::vector<uint8_t> test_array = StringUtil::StringToByte(test_data);
    uint8_t* ptr = CopyVariableBuffer(test_array.data(), test_array.size(),
                                      buffer->data());
    if (ptr != buffer->data()) {
      int diff_size = ptr - (uint8_t*)buffer->data();
      buffer->resize(diff_size);
      is_success = true;
    }
    return is_success;
  }